

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageobj.c
# Opt level: O0

TidyMessageImpl *
tidyMessageCreateInitV
          (TidyDocImpl *doc,Node *node,uint code,int line,int column,TidyReportLevel level,
          __va_list_tag *args)

{
  Bool BVar1;
  uint uVar2;
  Bool BVar3;
  TidyMessageImpl *pTVar4;
  ctmbstr ptVar5;
  printfArg *ppVar6;
  tmbstr ptVar7;
  bool bVar8;
  TidyDoc tdoc_1;
  ctmbstr pc;
  char *pcStack_60;
  uint i;
  ctmbstr pattern;
  va_list args_copy;
  TidyDoc tdoc;
  TidyMessageImpl *result;
  TidyReportLevel level_local;
  int column_local;
  int line_local;
  uint code_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pTVar4 = (TidyMessageImpl *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x90);
  pTVar4->tidyDoc = doc;
  pTVar4->tidyNode = node;
  pTVar4->code = code;
  pTVar4->line = line;
  pTVar4->column = column;
  pTVar4->level = level;
  pTVar4->muted = no;
  pc._4_4_ = 0;
  while( true ) {
    bVar8 = false;
    if ((doc->muted).list != (tidyStrings *)0x0) {
      bVar8 = (doc->muted).list[pc._4_4_] != 0;
    }
    if (!bVar8) goto LAB_001739fe;
    if ((doc->muted).list[pc._4_4_] == code) break;
    pc._4_4_ = pc._4_4_ + 1;
  }
  pTVar4->muted = yes;
LAB_001739fe:
  args_copy[0].overflow_arg_area = args->reg_save_area;
  pattern = *(ctmbstr *)args;
  args_copy[0]._0_8_ = args->overflow_arg_area;
  ptVar5 = tidyDefaultString(code);
  ppVar6 = BuildArgArray(doc,ptVar5,(__va_list_tag *)&pattern,&pTVar4->argcount);
  pTVar4->arguments = ppVar6;
  ptVar5 = prvTidytidyErrorCodeAsKey(code);
  pTVar4->messageKey = ptVar5;
  ptVar5 = tidyDefaultString(code);
  pTVar4->messageFormatDefault = ptVar5;
  ptVar5 = tidyLocalizedString(code);
  pTVar4->messageFormat = ptVar5;
  ptVar7 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar4->messageDefault = ptVar7;
  args_copy[0].overflow_arg_area = args->reg_save_area;
  pattern = *(ctmbstr *)args;
  args_copy[0]._0_8_ = args->overflow_arg_area;
  prvTidytmbvsnprintf(pTVar4->messageDefault,0x800,pTVar4->messageFormatDefault,
                      (__va_list_tag *)&pattern);
  ptVar7 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar4->message = ptVar7;
  args_copy[0].overflow_arg_area = args->reg_save_area;
  pattern = *(ctmbstr *)args;
  args_copy[0]._0_8_ = args->overflow_arg_area;
  prvTidytmbvsnprintf(pTVar4->message,0x800,pTVar4->messageFormat,(__va_list_tag *)&pattern);
  ptVar7 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar4->messagePosDefault = ptVar7;
  ptVar7 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar4->messagePos = ptVar7;
  if (((int)(doc->config).value[0x13].v == 0) || ((doc->config).value[0x14].v == 0)) {
    if (((int)(doc->config).value[0x4a].v == 0) || ((doc->config).value[0x14].v == 0)) {
      ptVar7 = pTVar4->messagePosDefault;
      ptVar5 = tidyDefaultString(0x1f5);
      prvTidytmbsnprintf(ptVar7,0x800,ptVar5,(ulong)(uint)line,(ulong)(uint)column);
      ptVar7 = pTVar4->messagePos;
      ptVar5 = tidyLocalizedString(0x1f5);
      prvTidytmbsnprintf(ptVar7,0x800,ptVar5,(ulong)(uint)line,(ulong)(uint)column);
    }
    else {
      ptVar7 = pTVar4->messagePosDefault;
      ptVar5 = tidyDefaultString(0x1f6);
      prvTidytmbsnprintf(ptVar7,0x800,ptVar5,(doc->config).value[0x14].v,(ulong)(uint)line,
                         (ulong)(uint)column);
      ptVar7 = pTVar4->messagePos;
      ptVar5 = tidyLocalizedString(0x1f6);
      prvTidytmbsnprintf(ptVar7,0x800,ptVar5,(doc->config).value[0x14].v,(ulong)(uint)line,
                         (ulong)(uint)column);
    }
  }
  else {
    prvTidytmbsnprintf(pTVar4->messagePosDefault,0x800,"%s:%d:%d: ",(doc->config).value[0x14].v,
                       (ulong)(uint)line,(ulong)(uint)column);
    prvTidytmbsnprintf(pTVar4->messagePos,0x800,"%s:%d:%d: ",(doc->config).value[0x14].v,
                       (ulong)(uint)line,(ulong)(uint)column);
  }
  ptVar5 = tidyDefaultString(level);
  pTVar4->messagePrefixDefault = ptVar5;
  ptVar5 = tidyLocalizedString(level);
  pTVar4->messagePrefix = ptVar5;
  if ((line < 1) || (column < 1)) {
    pcStack_60 = "%.0s%s%s";
  }
  else {
    pcStack_60 = "%s%s%s";
  }
  if (TidyFatal < level) {
    pcStack_60 = "%.0s%.0s%s";
  }
  ptVar7 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar4->messageOutputDefault = ptVar7;
  prvTidytmbsnprintf(pTVar4->messageOutputDefault,0x800,pcStack_60,pTVar4->messagePosDefault,
                     pTVar4->messagePrefixDefault,pTVar4->messageDefault);
  ptVar7 = (tmbstr)(*doc->allocator->vtbl->alloc)(doc->allocator,0x800);
  pTVar4->messageOutput = ptVar7;
  prvTidytmbsnprintf(pTVar4->messageOutput,0x800,pcStack_60,pTVar4->messagePos,pTVar4->messagePrefix
                     ,pTVar4->message);
  if (((int)(doc->config).value[0x37].v == 1) && (level < TidyDialogueSummary)) {
    ptVar5 = prvTidytidyErrorCodeAsKey(code);
    uVar2 = prvTidytmbstrlen(pTVar4->messageOutputDefault);
    if (uVar2 < 0x800) {
      prvTidytmbsnprintf(pTVar4->messageOutputDefault + uVar2,(ulong)(0x800 - uVar2)," (%s)",ptVar5)
      ;
    }
    uVar2 = prvTidytmbstrlen(pTVar4->messageOutput);
    if (uVar2 < 0x800) {
      prvTidytmbsnprintf(pTVar4->messageOutput + uVar2,(ulong)(0x800 - uVar2)," (%s)",ptVar5);
    }
  }
  pTVar4->allowMessage = yes;
  if ((pTVar4->level < TidyDialogueSummary) && (doc->reportFilter != (TidyReportFilter)0x0)) {
    BVar1 = pTVar4->allowMessage;
    BVar3 = (*doc->reportFilter)
                      ((TidyDoc)doc,pTVar4->level,pTVar4->line,pTVar4->column,pTVar4->messageOutput)
    ;
    pTVar4->allowMessage = BVar1 & BVar3;
  }
  if ((pTVar4->level < TidyDialogueSummary) && (doc->reportCallback != (TidyReportCallback)0x0)) {
    args_copy[0].overflow_arg_area = args->reg_save_area;
    pattern = *(ctmbstr *)args;
    args_copy[0]._0_8_ = args->overflow_arg_area;
    BVar1 = pTVar4->allowMessage;
    BVar3 = (*doc->reportCallback)
                      ((TidyDoc)doc,pTVar4->level,pTVar4->line,pTVar4->column,pTVar4->messageKey,
                       (__va_list_tag *)&pattern);
    pTVar4->allowMessage = BVar1 & BVar3;
  }
  if (doc->messageCallback != (TidyMessageCallback)0x0) {
    BVar1 = pTVar4->allowMessage;
    BVar3 = (*doc->messageCallback)((TidyMessage)pTVar4);
    pTVar4->allowMessage = BVar1 & BVar3;
  }
  return pTVar4;
}

Assistant:

static TidyMessageImpl *tidyMessageCreateInitV( TidyDocImpl *doc,
                                                Node *node,
                                                uint code,
                                                int line,
                                                int column,
                                                TidyReportLevel level,
                                                va_list args )
{
    TidyMessageImpl *result = TidyDocAlloc(doc, sizeof(TidyMessageImpl));
    TidyDoc tdoc = tidyImplToDoc(doc);
    va_list args_copy;
    enum { sizeMessageBuf=2048 };
    ctmbstr pattern;
    uint i = 0;


    /* Things we know... */

    result->tidyDoc = doc;
    result->tidyNode = node;
    result->code = code;
    result->line = line;
    result->column = column;
    result->level = level;
    /* Is #719 - set 'muted' before any callbacks. */
    result->muted = no;
    i = 0;
    while ((doc->muted.list) && (doc->muted.list[i] != 0))
    {
        if (doc->muted.list[i] == code)
        {
            result->muted = yes;
            break;
        }
        i++;
    }

    /* Things we create... */

    va_copy(args_copy, args);
    result->arguments = BuildArgArray(doc, tidyDefaultString(code), args_copy, &result->argcount);
    va_end(args_copy);

    result->messageKey = TY_(tidyErrorCodeAsKey)(code);

    result->messageFormatDefault = tidyDefaultString(code);
    result->messageFormat = tidyLocalizedString(code);

    result->messageDefault = TidyDocAlloc(doc, sizeMessageBuf);
    va_copy(args_copy, args);
    TY_(tmbvsnprintf)(result->messageDefault, sizeMessageBuf, result->messageFormatDefault, args_copy);
    va_end(args_copy);

    result->message = TidyDocAlloc(doc, sizeMessageBuf);
    va_copy(args_copy, args);
    TY_(tmbvsnprintf)(result->message, sizeMessageBuf, result->messageFormat, args_copy);
    va_end(args_copy);

    result->messagePosDefault = TidyDocAlloc(doc, sizeMessageBuf);
    result->messagePos = TidyDocAlloc(doc, sizeMessageBuf);

    if ( cfgBool(doc, TidyEmacs) && cfgStr(doc, TidyEmacsFile) )
    {
        /* Change formatting to be parsable by GNU Emacs */
        TY_(tmbsnprintf)(result->messagePosDefault, sizeMessageBuf, "%s:%d:%d: ", cfgStr(doc, TidyEmacsFile), line, column);
        TY_(tmbsnprintf)(result->messagePos, sizeMessageBuf, "%s:%d:%d: ", cfgStr(doc, TidyEmacsFile), line, column);
    }
    else if ( cfgBool(doc, TidyShowFilename) && cfgStr(doc, TidyEmacsFile) )
    {
        /* Include filename in output */
        TY_(tmbsnprintf)(result->messagePosDefault, sizeMessageBuf, tidyDefaultString(FN_LINE_COLUMN_STRING),
            cfgStr(doc, TidyEmacsFile), line, column);
        TY_(tmbsnprintf)(result->messagePos, sizeMessageBuf, tidyLocalizedString(FN_LINE_COLUMN_STRING),
            cfgStr(doc, TidyEmacsFile), line, column);
    }
    else
    {
        /* traditional format */
        TY_(tmbsnprintf)(result->messagePosDefault, sizeMessageBuf, tidyDefaultString(LINE_COLUMN_STRING), line, column);
        TY_(tmbsnprintf)(result->messagePos, sizeMessageBuf, tidyLocalizedString(LINE_COLUMN_STRING), line, column);
    }

    result->messagePrefixDefault = tidyDefaultString(level);

    result->messagePrefix = tidyLocalizedString(level);

    if ( line > 0 && column > 0 )
        pattern = "%s%s%s";      /* pattern if there's location information */
    else
        pattern = "%.0s%s%s";    /* otherwise if there isn't */

    if ( level > TidyFatal )
        pattern = "%.0s%.0s%s";  /* dialog doesn't have pos or prefix */

    result->messageOutputDefault = TidyDocAlloc(doc, sizeMessageBuf);
    TY_(tmbsnprintf)(result->messageOutputDefault, sizeMessageBuf, pattern,
                     result->messagePosDefault, result->messagePrefixDefault,
                     result->messageDefault);

    result->messageOutput = TidyDocAlloc(doc, sizeMessageBuf);
    TY_(tmbsnprintf)(result->messageOutput, sizeMessageBuf, pattern,
                     result->messagePos, result->messagePrefix,
                     result->message);

    if ( ( cfgBool(doc, TidyMuteShow) == yes ) && level <= TidyFatal )
    {
        /*\ Issue #655 - Unsafe to use output buffer as one of the va_list
         *  input parameters in some snprintf implmentations.
        \*/
        ctmbstr pc = TY_(tidyErrorCodeAsKey)(code);
        i = TY_(tmbstrlen)(result->messageOutputDefault);
        if (i < sizeMessageBuf)
            TY_(tmbsnprintf)(result->messageOutputDefault + i, sizeMessageBuf - i, " (%s)", pc );
        i = TY_(tmbstrlen)(result->messageOutput);
        if (i < sizeMessageBuf)
            TY_(tmbsnprintf)(result->messageOutput + i, sizeMessageBuf - i, " (%s)", pc );
        i = 0;
    }

    result->allowMessage = yes;

    /* reportFilter is a simple error filter that provides minimal information
       to callback functions, and includes the message buffer in LibTidy's
       configured localization. As it's a "legacy" API, it does not receive
       TidyDialogue messages.*/
    if ( (result->level <= TidyFatal) && doc->reportFilter )
    {
        result->allowMessage = result->allowMessage & doc->reportFilter( tdoc, result->level, result->line, result->column, result->messageOutput );
    }

    /* reportCallback is intended to allow LibTidy users to localize messages
       via their own means by providing a key and the parameters to fill it. 
       As it's a "legacy" API, it does not receive TidyDialogue messages. */
    if ( (result->level <= TidyFatal) && doc->reportCallback )
    {
        TidyDoc tdoc = tidyImplToDoc( doc );
        va_copy(args_copy, args);
        result->allowMessage = result->allowMessage & doc->reportCallback( tdoc, result->level, result->line, result->column, result->messageKey, args_copy );
        va_end(args_copy);
    }

    /* messageCallback is the newest interface to interrogate Tidy's
       emitted messages. */
    if ( doc->messageCallback )
    {
        result->allowMessage = result->allowMessage & doc->messageCallback( tidyImplToMessage(result) );
    }

    return result;
}